

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_rawgeti(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  cTValue *local_60;
  cTValue *t;
  cTValue *v;
  int n_local;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,idx);
  if ((uint)n < *(uint *)((pTVar1->u64 & 0x7fffffffffff) + 0x30)) {
    local_60 = (cTValue *)(*(long *)((pTVar1->u64 & 0x7fffffffffff) + 0x10) + (long)n * 8);
  }
  else {
    local_60 = lj_tab_getinth((GCtab *)(pTVar1->u64 & 0x7fffffffffff),n);
  }
  if (local_60 == (cTValue *)0x0) {
    L->top->u64 = 0xffffffffffffffff;
  }
  else {
    *L->top = *local_60;
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L);
  }
  return;
}

Assistant:

LUA_API void lua_rawgeti(lua_State *L, int idx, int n)
{
  cTValue *v, *t = index2adr(L, idx);
  lj_checkapi(tvistab(t), "stack slot %d is not a table", idx);
  v = lj_tab_getint(tabV(t), n);
  if (v) {
    copyTV(L, L->top, v);
  } else {
    setnilV(L->top);
  }
  incr_top(L);
}